

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

void __thiscall
wasm::SmallVector<unsigned_int,_5UL>::push_back(SmallVector<unsigned_int,_5UL> *this,uint *x)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = this->usedFixed;
  if (uVar2 < 5) {
    uVar1 = *x;
    this->usedFixed = uVar2 + 1;
    (this->fixed)._M_elems[uVar2] = uVar1;
    return;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->flexible,x);
  return;
}

Assistant:

void push_back(const T& x) {
    if (usedFixed < N) {
      fixed[usedFixed++] = x;
    } else {
      flexible.push_back(x);
    }
  }